

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

pair<unsigned_long,_bool> __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::find_or_prepare_insert<char[9]>
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,char (*key) [9],size_t hashval)

{
  char *pcVar1;
  ulong uVar2;
  uint uVar3;
  ushort uVar4;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  char cVar14;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  undefined1 auVar15 [16];
  pair<unsigned_long,_bool> pVar31;
  __m128i match;
  long local_98;
  size_t local_90;
  char (*local_78) [9];
  CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_70;
  char local_68;
  char cStack_67;
  char cStack_66;
  char cStack_65;
  char cStack_64;
  char cStack_63;
  char cStack_62;
  char cStack_61;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  char cStack_5d;
  char cStack_5c;
  char cStack_5b;
  char cStack_5a;
  char cStack_59;
  size_t local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  uVar2 = this->capacity_;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x96,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
  }
  uVar8 = hashval >> 7 & uVar2;
  auVar13 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
  auVar13 = pshuflw(auVar13,auVar13,0);
  local_48 = auVar13._0_4_;
  local_98 = 0;
  local_50 = hashval;
  uStack_44 = local_48;
  uStack_40 = local_48;
  uStack_3c = local_48;
  do {
    pcVar1 = this->ctrl_ + uVar8;
    cVar14 = *pcVar1;
    cVar16 = pcVar1[1];
    cVar17 = pcVar1[2];
    cVar18 = pcVar1[3];
    cVar19 = pcVar1[4];
    cVar20 = pcVar1[5];
    cVar21 = pcVar1[6];
    cVar22 = pcVar1[7];
    cVar23 = pcVar1[8];
    cVar24 = pcVar1[9];
    cVar25 = pcVar1[10];
    cVar26 = pcVar1[0xb];
    cVar27 = pcVar1[0xc];
    cVar28 = pcVar1[0xd];
    cVar29 = pcVar1[0xe];
    cVar30 = pcVar1[0xf];
    auVar13[0] = -((char)local_48 == cVar14);
    auVar13[1] = -(local_48._1_1_ == cVar16);
    auVar13[2] = -(local_48._2_1_ == cVar17);
    auVar13[3] = -(local_48._3_1_ == cVar18);
    auVar13[4] = -((char)uStack_44 == cVar19);
    auVar13[5] = -(uStack_44._1_1_ == cVar20);
    auVar13[6] = -(uStack_44._2_1_ == cVar21);
    auVar13[7] = -(uStack_44._3_1_ == cVar22);
    auVar13[8] = -((char)uStack_40 == cVar23);
    auVar13[9] = -(uStack_40._1_1_ == cVar24);
    auVar13[10] = -(uStack_40._2_1_ == cVar25);
    auVar13[0xb] = -(uStack_40._3_1_ == cVar26);
    auVar13[0xc] = -((char)uStack_3c == cVar27);
    auVar13[0xd] = -(uStack_3c._1_1_ == cVar28);
    auVar13[0xe] = -(uStack_3c._2_1_ == cVar29);
    auVar13[0xf] = -(uStack_3c._3_1_ == cVar30);
    uVar4 = (ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe | (ushort)(auVar13[0xf] >> 7) << 0xf;
    bVar12 = uVar4 == 0;
    iVar11 = 4;
    if (!bVar12) {
      uVar10 = (uint)uVar4;
      uVar3 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      sVar7 = uVar3 + uVar8 & uVar2;
      lhs = this->slots_ + sVar7;
      local_68 = cVar14;
      cStack_67 = cVar16;
      cStack_66 = cVar17;
      cStack_65 = cVar18;
      cStack_64 = cVar19;
      cStack_63 = cVar20;
      cStack_62 = cVar21;
      cStack_61 = cVar22;
      cStack_60 = cVar23;
      cStack_5f = cVar24;
      cStack_5e = cVar25;
      cStack_5d = cVar26;
      cStack_5c = cVar27;
      cStack_5b = cVar28;
      cStack_5a = cVar29;
      cStack_59 = cVar30;
      while (local_78 = key, local_70 = &this->settings_,
            bVar5 = raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::EqualElement<char[9]>::operator()(&local_78,lhs,lhs), cVar14 = local_68,
            cVar16 = cStack_67, cVar17 = cStack_66, cVar18 = cStack_65, cVar19 = cStack_64,
            cVar20 = cStack_63, cVar21 = cStack_62, cVar22 = cStack_61, cVar23 = cStack_60,
            cVar24 = cStack_5f, cVar25 = cStack_5e, cVar26 = cStack_5d, cVar27 = cStack_5c,
            cVar28 = cStack_5b, cVar29 = cStack_5a, cVar30 = cStack_59, !bVar5) {
        uVar10 = uVar10 - 1 & uVar10;
        bVar12 = uVar10 == 0;
        iVar11 = 4;
        if (bVar12) goto LAB_0018e04c;
        uVar3 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        sVar7 = uVar3 + uVar8 & uVar2;
        lhs = this->slots_ + sVar7;
      }
      iVar11 = 1;
      local_90 = sVar7;
    }
LAB_0018e04c:
    if (bVar12) {
      auVar15[0] = -(cVar14 == -0x80);
      auVar15[1] = -(cVar16 == -0x80);
      auVar15[2] = -(cVar17 == -0x80);
      auVar15[3] = -(cVar18 == -0x80);
      auVar15[4] = -(cVar19 == -0x80);
      auVar15[5] = -(cVar20 == -0x80);
      auVar15[6] = -(cVar21 == -0x80);
      auVar15[7] = -(cVar22 == -0x80);
      auVar15[8] = -(cVar23 == -0x80);
      auVar15[9] = -(cVar24 == -0x80);
      auVar15[10] = -(cVar25 == -0x80);
      auVar15[0xb] = -(cVar26 == -0x80);
      auVar15[0xc] = -(cVar27 == -0x80);
      auVar15[0xd] = -(cVar28 == -0x80);
      auVar15[0xe] = -(cVar29 == -0x80);
      auVar15[0xf] = -(cVar30 == -0x80);
      iVar11 = 3;
      if ((((((((((((((((auVar15 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar15 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar15 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar15 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar15 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar15 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar15 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar15 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar15 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar15 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar15 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar15 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar15 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar15 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar15 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar15[0xf])
      {
        lVar9 = uVar8 + local_98;
        local_98 = local_98 + 0x10;
        uVar8 = lVar9 + 0x10U & uVar2;
        iVar11 = 0;
      }
    }
    if (iVar11 != 0) {
      if (iVar11 == 3) {
        local_90 = prepare_insert(this,local_50);
        uVar6 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      }
      else {
        uVar6 = 0;
      }
      pVar31._8_8_ = uVar6;
      pVar31.first = local_90;
      return pVar31;
    }
  } while( true );
}

Assistant:

std::pair<size_t, bool> find_or_prepare_insert(const K& key, size_t hashval)
			{
				auto seq = probe(hashval);
				while (true) {
					Group g{ctrl_ + seq.offset()};
					for (uint32_t i : g.Match((h2_t)H2(hashval))) {
						if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
						                           EqualElement<K> {key, eq_ref()},
						                           PolicyTraits::element(slots_ + seq.offset((size_t)i)))))
							return {seq.offset((size_t)i), false};
					}
					if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) break;
					seq.next();
				}
				return {prepare_insert(hashval), true};
			}